

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

btMatrixX<float> * __thiscall btMatrixX<float>::negative(btMatrixX<float> *this)

{
  int iVar1;
  btMatrixX<float> *in_RSI;
  btMatrixX<float> *in_RDI;
  float v;
  int j;
  int i;
  btMatrixX<float> *neg;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  btMatrixX<float> *in_stack_ffffffffffffffa0;
  undefined4 local_28;
  undefined4 local_18;
  
  rows(in_RSI);
  cols(in_RSI);
  btMatrixX(in_RSI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  for (local_18 = 0; iVar1 = rows(in_RSI), local_18 < iVar1; local_18 = local_18 + 1) {
    for (local_28 = 0; iVar1 = cols(in_RSI), local_28 < iVar1; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffa0 =
           (btMatrixX<float> *)
           operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
      ;
      setElem(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0.0);
    }
  }
  return in_RDI;
}

Assistant:

btMatrixX negative()
	{
		btMatrixX neg(rows(),cols());
		for (int i=0;i<rows();i++)
			for (int j=0;j<cols();j++)
			{
				T v = (*this)(i,j);
				neg.setElem(i,j,-v);
			}
		return neg;
	}